

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

bool __thiscall
pybind11::detail::
list_caster<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::pair<long,_long>_>
::load(list_caster<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::pair<long,_long>_>
       *this,handle src,bool convert)

{
  pointer ppVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  sequence_iterator sVar5;
  sequence s;
  reference it;
  value_conv conv;
  handle local_98;
  handle local_90;
  pair<long,_long> local_88;
  vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *local_78;
  PyObject *local_70;
  PyObject *local_60;
  long local_58;
  object local_50;
  tuple_caster<std::pair,_long,_long> local_48;
  
  bVar2 = sequence::check_(src);
  if (bVar2) {
    if (src.m_ptr == (PyObject *)0x0) {
      local_98.m_ptr = (PyObject *)0x0;
    }
    else {
      if (((src.m_ptr)->ob_type->tp_flags & 0x18000000) != 0) goto LAB_001c58a4;
      (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
      local_98.m_ptr = src.m_ptr;
    }
    ppVar1 = (this->value).
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->value).
        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl.
        super__Vector_impl_data._M_finish != ppVar1) {
      (this->value).
      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl.
      super__Vector_impl_data._M_finish = ppVar1;
    }
    if (local_98.m_ptr != (PyObject *)0x0) {
      (local_98.m_ptr)->ob_refcnt = (local_98.m_ptr)->ob_refcnt + 1;
    }
    local_90.m_ptr = local_98.m_ptr;
    reserve_maybe<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_0>
              (this,(sequence *)&local_90,&this->value);
    object::~object((object *)&local_90);
    local_70 = local_98.m_ptr;
    sVar5 = sequence::end((sequence *)&local_98);
    local_78 = (vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)this;
    for (lVar4 = 0; bVar2 = sVar5.super_sequence_slow_readwrite.index == lVar4, !bVar2;
        lVar4 = lVar4 + 1) {
      local_60 = local_70;
      local_50.super_handle.m_ptr = (handle)(PyObject *)0x0;
      local_48.subcasters.first.value = 0;
      local_48.subcasters.second.value = 0;
      local_58 = lVar4;
      accessor::operator_cast_to_object((accessor *)&local_88);
      bVar3 = tuple_caster<std::pair,_long,_long>::load(&local_48,(handle)local_88.first,convert);
      object::~object((object *)&local_88);
      if (!bVar3) {
        object::~object(&local_50);
        break;
      }
      local_88.first = local_48.subcasters.first.value;
      local_88.second = local_48.subcasters.second.value;
      std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
      emplace_back<std::pair<long,long>>(local_78,&local_88);
      object::~object(&local_50);
    }
    object::~object((object *)&local_98);
  }
  else {
LAB_001c58a4:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }